

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kkt_solver_basis.cc
# Opt level: O0

void __thiscall ipx::KKTSolverBasis::DropPrimal(KKTSolverBasis *this,Iterate *iterate,Info *info)

{
  double dVar1;
  bool bVar2;
  BasicStatus BVar3;
  Int IVar4;
  double *pdVar5;
  reference pvVar6;
  ostream *poVar7;
  ostream *poVar8;
  long in_RDX;
  Iterate *in_RSI;
  int __x;
  long in_RDI;
  Basis *this_00;
  double extraout_XMM0_Qa;
  bool exchanged;
  double pivot;
  anon_class_32_4_ca84b024 search_pivot;
  double vmax;
  Int jmax;
  double s;
  Int p_2;
  Int jb_1;
  Int j;
  Int p_1;
  Vector invscale_basic;
  double zj;
  double xj;
  Int jb;
  Int p;
  vector<int,_std::allocator<int>_> candidates;
  double volume_tol;
  double drop_primal;
  IndexedVector row;
  IndexedVector btran;
  Vector *zu;
  Vector *zl;
  Vector *xu;
  Vector *xl;
  Int n;
  Int m;
  double *in_stack_fffffffffffffd68;
  Iterate *in_stack_fffffffffffffd70;
  Basis *in_stack_fffffffffffffd78;
  Basis *in_stack_fffffffffffffd80;
  bool *in_stack_fffffffffffffd88;
  double *in_stack_fffffffffffffd90;
  Control *in_stack_fffffffffffffd98;
  IndexedVector *in_stack_fffffffffffffda0;
  Basis *in_stack_fffffffffffffda8;
  IndexedVector *in_stack_fffffffffffffdb0;
  double in_stack_fffffffffffffe50;
  IndexedVector *in_stack_fffffffffffffe58;
  IndexedVector *in_stack_fffffffffffffe60;
  Int in_stack_fffffffffffffe6c;
  byte local_179;
  string local_178 [32];
  double local_158;
  double *local_148;
  undefined8 *local_140;
  int *local_138;
  undefined8 local_130;
  int local_124;
  double local_120;
  Int local_118;
  value_type local_114;
  Int local_110;
  int local_10c;
  valarray<double> local_108;
  undefined4 local_f4;
  double local_f0;
  double local_e8;
  int local_e0;
  int local_dc;
  undefined8 local_c0;
  Basis *local_b8;
  undefined1 local_a0 [96];
  Vector *local_40;
  Vector *local_38;
  Vector *local_30;
  Vector *local_28;
  Int local_20;
  Int local_1c;
  long local_18;
  Iterate *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_1c = Model::rows(*(Model **)(in_RDI + 0x10));
  local_20 = Model::cols(*(Model **)(in_RDI + 0x10));
  local_28 = Iterate::xl(local_10);
  local_30 = Iterate::xu(local_10);
  local_38 = Iterate::zl(local_10);
  local_40 = Iterate::zu(local_10);
  IndexedVector::IndexedVector
            (in_stack_fffffffffffffda0,(Int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
  IndexedVector::IndexedVector
            (in_stack_fffffffffffffda0,(Int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
  this_00 = (Basis *)Control::ipm_drop_primal(*(Control **)(in_RDI + 8));
  local_c0 = 0x4000000000000000;
  *(undefined4 *)(local_18 + 0xc) = 0;
  local_b8 = this_00;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x83222b);
  for (local_dc = 0; local_dc < local_1c; local_dc = local_dc + 1) {
    in_stack_fffffffffffffe6c =
         Basis::operator[]((Basis *)in_stack_fffffffffffffd70,
                           (Int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
    local_e0 = in_stack_fffffffffffffe6c;
    BVar3 = Basis::StatusOf(in_stack_fffffffffffffd78,
                            (Int)((ulong)in_stack_fffffffffffffd70 >> 0x20));
    if (BVar3 == BASIC) {
      in_stack_fffffffffffffe60 =
           (IndexedVector *)std::valarray<double>::operator[](local_28,(long)local_e0);
      in_stack_fffffffffffffe50 = (double)(in_stack_fffffffffffffe60->elements_)._M_size;
      in_stack_fffffffffffffe58 =
           (IndexedVector *)std::valarray<double>::operator[](local_30,(long)local_e0);
      if ((double)(in_stack_fffffffffffffe58->elements_)._M_size < in_stack_fffffffffffffe50) {
        pdVar5 = std::valarray<double>::operator[](local_30,(long)local_e0);
        local_e8 = *pdVar5;
        pdVar5 = std::valarray<double>::operator[](local_40,(long)local_e0);
        local_f0 = *pdVar5;
      }
      else {
        pdVar5 = std::valarray<double>::operator[](local_28,(long)local_e0);
        local_e8 = *pdVar5;
        pdVar5 = std::valarray<double>::operator[](local_38,(long)local_e0);
        local_f0 = *pdVar5;
      }
      if ((local_e8 < local_f0 * 0.01) && (local_e8 <= (double)local_b8)) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd80,
                   (value_type_conflict2 *)in_stack_fffffffffffffd78);
      }
    }
  }
  bVar2 = std::vector<int,_std::allocator<int>_>::empty
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd80);
  if (bVar2) {
    local_f4 = 1;
  }
  else {
    std::valarray<double>::valarray
              ((valarray<double> *)in_stack_fffffffffffffd70,(size_t)in_stack_fffffffffffffd68);
    for (local_10c = 0; local_10c < local_1c; local_10c = local_10c + 1) {
      local_110 = Basis::operator[]((Basis *)in_stack_fffffffffffffd70,
                                    (Int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
      pdVar5 = std::valarray<double>::operator[]
                         ((valarray<double> *)(in_RDI + 0x228),(long)local_110);
      dVar1 = *pdVar5;
      pdVar5 = std::valarray<double>::operator[](&local_108,(long)local_10c);
      *pdVar5 = 1.0 / dVar1;
    }
LAB_008325d3:
    bVar2 = std::vector<int,_std::allocator<int>_>::empty
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd80);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_f4 = 0;
    }
    else {
      pvVar6 = std::vector<int,_std::allocator<int>_>::back
                         ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd70);
      local_114 = *pvVar6;
      local_118 = Basis::PositionOf(in_stack_fffffffffffffd80,
                                    (Int)((ulong)in_stack_fffffffffffffd78 >> 0x20));
      pdVar5 = std::valarray<double>::operator[](&local_108,(long)local_118);
      local_120 = *pdVar5;
      Basis::TableauRow(this_00,in_stack_fffffffffffffe6c,in_stack_fffffffffffffe60,
                        in_stack_fffffffffffffe58,SUB81((ulong)in_stack_fffffffffffffe50 >> 0x38,0))
      ;
      local_124 = -1;
      local_130 = 0x4000000000000000;
      local_148 = &local_120;
      local_140 = &local_130;
      local_138 = &local_124;
      for_each_nonzero<ipx::KKTSolverBasis::DropPrimal(ipx::Iterate*,ipx::Info*)::__0>
                (in_stack_fffffffffffffdb0,(anon_class_32_4_ca84b024 *)in_stack_fffffffffffffda8);
      if (local_124 < 0) {
        in_stack_fffffffffffffda8 =
             (Basis *)std::valarray<double>::operator[](local_38,(long)local_114);
        IVar4 = (Int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
        in_stack_fffffffffffffd98 = in_stack_fffffffffffffda8->control_;
        in_stack_fffffffffffffda0 =
             (IndexedVector *)std::valarray<double>::operator[](local_28,(long)local_114);
        in_stack_fffffffffffffd88 =
             (bool *)((double)in_stack_fffffffffffffd98 /
                     (double)(in_stack_fffffffffffffda0->elements_)._M_size);
        in_stack_fffffffffffffd90 = std::valarray<double>::operator[](local_40,(long)local_114);
        in_stack_fffffffffffffd78 = (Basis *)*in_stack_fffffffffffffd90;
        in_stack_fffffffffffffd80 =
             (Basis *)std::valarray<double>::operator[](local_30,(long)local_114);
        if ((double)in_stack_fffffffffffffd88 <=
            (double)in_stack_fffffffffffffd78 / (double)in_stack_fffffffffffffd80->control_) {
          Iterate::make_implied_ub(in_stack_fffffffffffffd70,IVar4);
        }
        else {
          Iterate::make_implied_lb(in_stack_fffffffffffffd70,IVar4);
        }
        Basis::FreeBasicVariable
                  (in_stack_fffffffffffffd80,(Int)((ulong)in_stack_fffffffffffffd78 >> 0x20));
        in_stack_fffffffffffffd70 =
             (Iterate *)std::valarray<double>::operator[](&local_108,(long)local_118);
        in_stack_fffffffffffffd70->model_ = (Model *)0x0;
        in_stack_fffffffffffffd68 =
             std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x228),(long)local_114)
        ;
        *in_stack_fffffffffffffd68 = INFINITY;
        *(int *)(local_18 + 0x48) = *(int *)(local_18 + 0x48) + 1;
        goto LAB_00832ad1;
      }
      __x = (int)local_a0;
      pdVar5 = IndexedVector::operator[]
                         ((IndexedVector *)in_stack_fffffffffffffd70,
                          (Int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
      local_158 = *pdVar5;
      std::abs(__x);
      if (extraout_XMM0_Qa < 0.001) {
        poVar7 = Control::Debug(*(Control **)(in_RDI + 8),3);
        poVar8 = std::operator<<(poVar7," |pivot| = ");
        std::abs((int)poVar7);
        sci2_abi_cxx11_((double)in_stack_fffffffffffffd68);
        poVar7 = std::operator<<(poVar8,local_178);
        std::operator<<(poVar7," (primal basic variable close to bound)\n");
        std::__cxx11::string::~string(local_178);
      }
      IVar4 = Basis::ExchangeIfStable
                        (in_stack_fffffffffffffda8,(Int)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                         (Int)in_stack_fffffffffffffda0,(double)in_stack_fffffffffffffd98,
                         (int)((ulong)in_stack_fffffffffffffd90 >> 0x20),in_stack_fffffffffffffd88);
      *(Int *)(local_18 + 0xc) = IVar4;
      if (*(int *)(local_18 + 0xc) == 0) goto LAB_008328af;
      local_f4 = 1;
    }
    std::valarray<double>::~valarray((valarray<double> *)in_stack_fffffffffffffd70);
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd80);
  IndexedVector::~IndexedVector((IndexedVector *)in_stack_fffffffffffffd70);
  IndexedVector::~IndexedVector((IndexedVector *)in_stack_fffffffffffffd70);
  return;
LAB_008328af:
  if ((local_179 & 1) != 0) {
    pdVar5 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x228),(long)local_124)
    ;
    in_stack_fffffffffffffdb0 = (IndexedVector *)(1.0 / *pdVar5);
    pdVar5 = std::valarray<double>::operator[](&local_108,(long)local_118);
    *pdVar5 = (double)in_stack_fffffffffffffdb0;
    *(int *)(local_18 + 0xd4) = *(int *)(local_18 + 0xd4) + 1;
    *(int *)(in_RDI + 0x244) = *(int *)(in_RDI + 0x244) + 1;
LAB_00832ad1:
    std::vector<int,_std::allocator<int>_>::pop_back((vector<int,_std::allocator<int>_> *)0x832ade);
  }
  goto LAB_008325d3;
}

Assistant:

void KKTSolverBasis::DropPrimal(Iterate* iterate, Info* info) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Vector& xl = iterate->xl();
    const Vector& xu = iterate->xu();
    const Vector& zl = iterate->zl();
    const Vector& zu = iterate->zu();
    IndexedVector btran(m), row(n+m);
    const double drop_primal = control_.ipm_drop_primal();
    const double volume_tol = 2.0;
    info->errflag = 0;

    std::vector<Int> candidates;
    for (Int p = 0; p < m; p++) {
        Int jb = basis_[p];
        if (basis_.StatusOf(jb) != Basis::BASIC) // ignore free variables
            continue;
        assert(std::isfinite(xl[jb]) || std::isfinite(xu[jb]));
        assert(xl[jb] > 0.0);
        assert(xu[jb] > 0.0);
        double xj, zj;          // choose which bound is nearer
        if (xl[jb] <= xu[jb]) {
            xj = xl[jb];
            zj = zl[jb];
        } else {
            xj = xu[jb];
            zj = zu[jb];
        }
        if (xj < 0.01*zj && xj <= drop_primal)
            candidates.push_back(jb);
    }
    if (candidates.empty())
        return;

    // Maintain a copy of the inverse scaling factors of basic variables for
    // faster access.
    Vector invscale_basic(m);
    for (Int p = 0; p < m; p++) {
        Int j = basis_[p];
        invscale_basic[p] = 1.0 / colscale_[j];
        assert(std::isfinite(invscale_basic[p]));
        assert(invscale_basic[p] >= 0.0);
    }

    while (!candidates.empty()) {
        Int jb = candidates.back();
        Int p = basis_.PositionOf(jb);
        assert(p >= 0);
        // Pivot jb out of the basis if the volume increase sufficiently.
        const double s = invscale_basic[p];
        basis_.TableauRow(jb, btran, row, true);
        Int jmax = -1;
        double vmax = volume_tol;
        auto search_pivot = [&](Int j, double pivot) {
            pivot = std::abs(pivot);
            if (pivot > kPivotZeroTol) {
                double v = pivot * colscale_[j] * s;
                if (v > vmax) {
                    vmax = v;
                    jmax = j;
                }
            }
        };
        for_each_nonzero(row, search_pivot);
        if (jmax >= 0) {
            // Pivot jb out of the basis.
            double pivot = row[jmax];
            if (std::abs(pivot) < 1e-3)
                control_.Debug(3)
                    << " |pivot| = " << sci2(std::abs(pivot))
                    << " (primal basic variable close to bound)\n";
            assert(basis_.StatusOf(jmax) == Basis::NONBASIC);
            bool exchanged;
            info->errflag = basis_.ExchangeIfStable(jb, jmax, pivot, 1,
                                                    &exchanged);
            if (info->errflag)
                return;
            if (!exchanged)     // factorization was unstable, try again
                continue;
            invscale_basic[p] = 1.0 / colscale_[jmax];
            assert(std::isfinite(invscale_basic[p]));
            assert(invscale_basic[p] >= 0.0);
            info->updates_ipm++;
            basis_changes_++;
        } else {
            // Make variable jb "implied" at a bound.
            if (zl[jb]/xl[jb] > zu[jb]/xu[jb])
                iterate->make_implied_lb(jb);
            else
                iterate->make_implied_ub(jb);
            basis_.FreeBasicVariable(jb);
            invscale_basic[p] = 0.0;
            colscale_[jb] = INFINITY;
            info->primal_dropped++;
        }
        candidates.pop_back();
    }
}